

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkloader.c
# Opt level: O1

ktx_error_code_e
linearTilingPadCallback
          (int miplevel,int face,int width,int height,int depth,ktx_uint64_t faceLodSize,
          void *pixels,void *userdata)

{
  ktx_uint32_t kVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  void *__src;
  uint uVar7;
  long lVar8;
  VkSubresourceLayout subResLayout;
  VkImageSubresource subRes;
  long local_68 [2];
  ulong local_58;
  ulong local_50;
  ulong local_48;
  undefined4 local_3c;
  int local_38;
  int local_34;
  
  uVar6 = 1;
  local_3c = 1;
  local_38 = miplevel;
  local_34 = face;
  (**(code **)((long)userdata + 0xa8))
            (*(undefined8 *)((long)userdata + 0xf8),*(undefined8 *)((long)userdata + 0xf0),&local_3c
             ,local_68);
  kVar1 = ktxTexture_GetRowPitch(*(ktxTexture **)((long)userdata + 0x108),miplevel);
  uVar4 = (ulong)kVar1;
  if (local_58 == uVar4) {
    height = 1;
  }
  lVar8 = *(long *)((long)userdata + 0x108);
  if ((*(uint *)(lVar8 + 0x38) < 2) && (*(int *)(lVar8 + 0x30) != 3)) {
    uVar2 = 0;
    uVar5 = 0;
  }
  else {
    uVar2 = (**(code **)(*(long *)(lVar8 + 8) + 0x18))(lVar8,miplevel);
    uVar6 = *(uint *)(*(long *)((long)userdata + 0x108) + 0x38);
    if (uVar6 < 2) {
      local_50 = local_48;
      if (local_48 == uVar2) {
        depth = 1;
      }
    }
    else {
      depth = 1;
      if (local_50 != uVar2) {
        depth = uVar6 * *(int *)(*(long *)((long)userdata + 0x108) + 0x3c);
      }
    }
    uVar5 = local_50;
    uVar6 = depth;
    if (local_50 < uVar2) {
      __assert_fail("imageSize <= imagePitch",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                    ,0x2c5,
                    "ktx_error_code_e linearTilingPadCallback(int, int, int, int, int, ktx_uint64_t, void *, void *)"
                   );
    }
  }
  if ((uint)height < 2) {
    if (1 < uVar6) {
      faceLodSize = faceLodSize / uVar6;
    }
  }
  else {
    faceLodSize = local_58;
    if (uVar4 <= local_58) {
      faceLodSize = uVar4;
    }
  }
  if (uVar6 != 0) {
    uVar3 = 0;
    lVar8 = local_68[0];
    do {
      if (height != 0) {
        __src = (void *)(uVar2 * uVar3 + (long)pixels);
        uVar7 = height;
        do {
          memcpy((void *)(*(long *)((long)userdata + 0x100) + lVar8),__src,faceLodSize);
          lVar8 = lVar8 + local_58;
          __src = (void *)((long)__src + uVar4);
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      lVar8 = lVar8 + uVar5;
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar6);
  }
  return KTX_SUCCESS;
}

Assistant:

KTX_error_code
linearTilingPadCallback(int miplevel, int face,
                      int width, int height, int depth,
                      ktx_uint64_t faceLodSize,
                      void* pixels, void* userdata)
{
    user_cbdata_linear* ud = (user_cbdata_linear*)userdata;
    VkDeviceSize offset;
    ktx_size_t   imageSize = 0;
    VkDeviceSize imagePitch = 0;
    ktx_uint32_t srcRowPitch;
    ktx_uint32_t rowIterations;
    ktx_uint32_t imageIterations;
    ktx_uint32_t row, image;
    ktx_uint8_t* pSrc;
    ktx_size_t   copySize;
    VkSubresourceLayout subResLayout;
#if !defined(_MSC_VER) || _MSC_VER >= 1920
    VkImageSubresource subRes = {
      .aspectMask = VK_IMAGE_ASPECT_COLOR_BIT,
      .mipLevel = miplevel,
      .arrayLayer = face
    };
#else
    VkImageSubresource subRes = {0};
    subRes.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
    subRes.mipLevel = miplevel;
    subRes.arrayLayer = face;
#endif

    UNUSED(width);

    // Get sub resources layout. Includes row pitch, size,
    // offsets, etc.
    ud->vkFuncs.vkGetImageSubresourceLayout(ud->device, ud->destImage, &subRes,
                                &subResLayout);

    srcRowPitch = ktxTexture_GetRowPitch(ud->texture, miplevel);

    if (subResLayout.rowPitch != srcRowPitch)
        rowIterations = height;
    else
        rowIterations = 1;

    imageIterations = 1;
    // Arrays, including cube map arrays, or 3D textures
    // Note from the Vulkan spec:
    //  *  arrayPitch is undefined for images that were not
    //     created as arrays.
    //  *  depthPitch is defined only for 3D images.
    if (ud->texture->numLayers > 1 || ud->texture->numDimensions == 3) {
        imageSize = ktxTexture_GetImageSize(ud->texture, miplevel);
        if (ud->texture->numLayers > 1) {
            imagePitch = subResLayout.arrayPitch;
            if (imagePitch != imageSize)
                imageIterations
                        = ud->texture->numLayers * ud->texture->numFaces;
        } else {
            imagePitch = subResLayout.depthPitch;
            if (imagePitch != imageSize)
                imageIterations = depth;
        }
        assert(imageSize <= imagePitch);
    }

    if (rowIterations > 1) {
        // Copy the minimum of srcRowPitch, the GL_UNPACK_ALIGNMENT padded size,
        // and subResLayout.rowPitch.
        if (subResLayout.rowPitch < srcRowPitch)
            copySize = subResLayout.rowPitch;
        else
            copySize = srcRowPitch;
    } else if (imageIterations > 1)
        copySize = faceLodSize / imageIterations;
    else
        copySize = faceLodSize;

    offset = subResLayout.offset;
    // Copy image data to destImage via its mapped memory.
    for (image = 0; image < imageIterations; image++) {
        pSrc = (ktx_uint8_t*)pixels + imageSize * image;
        for (row = 0; row < rowIterations; row++) {
            memcpy(ud->dest + offset, pSrc, copySize);
            offset += subResLayout.rowPitch;
            pSrc += srcRowPitch;
          }
        offset += imagePitch;
    }
    return KTX_SUCCESS;
}